

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  ExpectationBase *pEVar3;
  _Rb_tree_node_base *p_Var4;
  ExpectationBase *__tmp;
  vector<testing::internal::ExpectationBase_*,_std::allocator<testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *next;
  ExpectationBase **local_58;
  iterator iStack_50;
  ExpectationBase **local_48;
  ExpectationBase *local_38;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this->retired_ == false) {
    local_58 = (ExpectationBase **)0x0;
    iStack_50._M_current = (ExpectationBase **)0x0;
    local_48 = (ExpectationBase **)0x0;
    local_58 = (ExpectationBase **)operator_new(8);
    iStack_50._M_current = local_58 + 1;
    *local_58 = this;
    local_48 = iStack_50._M_current;
    if (local_58 != iStack_50._M_current) {
      do {
        pEVar1 = iStack_50._M_current[-1];
        iStack_50._M_current = iStack_50._M_current + -1;
        for (p_Var4 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 !=
            &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          pEVar2 = *(ExpectationBase **)(p_Var4 + 1);
          local_38 = pEVar2;
          MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
          pEVar3 = local_38;
          if (pEVar2->retired_ == false) {
            MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
            pEVar3->retired_ = true;
            if (iStack_50._M_current == local_48) {
              std::
              vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
              ::_M_realloc_insert<testing::internal::ExpectationBase*const&>
                        ((vector<testing::internal::ExpectationBase*,std::allocator<testing::internal::ExpectationBase*>>
                          *)&local_58,iStack_50,&local_38);
            }
            else {
              *iStack_50._M_current = local_38;
              iStack_50._M_current = iStack_50._M_current + 1;
            }
          }
        }
      } while (local_58 != iStack_50._M_current);
    }
    if (local_58 != (ExpectationBase **)0x0) {
      operator_delete(local_58);
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  ::std::vector<ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      ExpectationBase* next = it->expectation_base().get();
      if (!next->is_retired()) {
        next->Retire();
        expectations.push_back(next);
      }
    }
  }
}